

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ParseObjectInit(Parse *pParse,sqlite3 *db)

{
  sqlite3 *in_RSI;
  Parse *in_RDI;
  
  memset(&in_RDI->zErrMsg,0,0xe0);
  memset(&in_RDI->sLastToken,0,0x88);
  in_RDI->pOuterParse = in_RSI->pParse;
  in_RSI->pParse = in_RDI;
  in_RDI->db = in_RSI;
  if (in_RSI->mallocFailed != '\0') {
    sqlite3ErrorMsg(in_RDI,"out of memory");
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ParseObjectInit(Parse *pParse, sqlite3 *db){
  memset(PARSE_HDR(pParse), 0, PARSE_HDR_SZ);
  memset(PARSE_TAIL(pParse), 0, PARSE_TAIL_SZ);
  assert( db->pParse!=pParse );
  pParse->pOuterParse = db->pParse;
  db->pParse = pParse;
  pParse->db = db;
  if( db->mallocFailed ) sqlite3ErrorMsg(pParse, "out of memory");
}